

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_type(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  uint uVar3;
  
  pCVar1 = conn->data;
  uVar3 = (uint)*(undefined8 *)&(pCVar1->set).field_0x978;
  if ((((uVar3 >> 0x1c & 1) != 0) && ((conn->proto).ftpc.file != (char *)0x0)) &&
     ((uint)((uVar3 >> 0xb & 1) == 0) * 8 + 0x41 != (int)(conn->proto).ftpc.transfertype)) {
    *(undefined4 *)((long)(pCVar1->req).protop + 0x10) = 1;
    CVar2 = ftp_nb_type(conn,(_Bool)((byte)(*(uint *)&(pCVar1->set).field_0x978 >> 0xb) & 1),
                        FTP_TYPE);
    return CVar2;
  }
  if ((*(int *)((long)(conn->data->req).protop + 0x10) == 1) &&
     ((conn->proto).ftpc.file != (char *)0x0)) {
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"SIZE %s");
    if (CVar2 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_SIZE;
      CVar2 = CURLE_OK;
    }
    return CVar2;
  }
  CVar2 = ftp_state_rest(conn);
  return CVar2;
}

Assistant:

static CURLcode ftp_state_type(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which in FTP can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && ftpc->file &&
     ftp_need_type(conn, data->set.prefer_ascii)) {
    /* The SIZE command is _not_ RFC 959 specified, and therefore many servers
       may not support it! It is however the only way we have to get a file's
       size! */

    ftp->transfer = FTPTRANSFER_INFO;
    /* this means no actual transfer will be made */

    /* Some servers return different sizes for different modes, and thus we
       must set the proper type before we check the size */
    result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_TYPE);
    if(result)
      return result;
  }
  else
    result = ftp_state_size(conn);

  return result;
}